

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O1

void cmSHA1_Final(sha_byte *digest,SHA_CTX *context)

{
  cm_sha2_uint64_t *data;
  int j;
  ulong uVar1;
  long lVar2;
  uint uVar3;
  
  if (context != (SHA_CTX *)0x0) {
    if (digest != (sha_byte *)0x0) {
      uVar3 = (context->s256).state[6] >> 3 & 0x3f;
      data = &(context->s256).bitcount;
      if (uVar3 == 0) {
        *data = 0;
        (context->s512).state[5] = 0;
        (context->s512).bitcount[0] = 0;
        (context->s512).bitcount[1] = 0;
        (context->s512).state[6] = 0;
        (context->s512).state[7] = 0;
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x30] = '\0';
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x31] = '\0';
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x32] = '\0';
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x33] = '\0';
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x34] = '\0';
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x35] = '\0';
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x36] = '\0';
        ((cm_sha2_uint8_t *)((long)context + 0x20))[0x37] = '\0';
        *(undefined1 *)data = 0x80;
      }
      else {
        *(undefined1 *)((long)data + (ulong)uVar3) = 0x80;
        if (uVar3 < 0x38) {
          memset((void *)((ulong)(uVar3 + 1) + (long)data),0,(ulong)(0x37 - uVar3));
        }
        else {
          if (uVar3 != 0x3f) {
            memset((void *)((ulong)(uVar3 + 1) + (long)data),0,(ulong)(uVar3 ^ 0x3f));
          }
          cmSHA1_Internal_Transform(context,(sha_word32 *)data);
          (context->s512).bitcount[0] = 0;
          (context->s512).bitcount[1] = 0;
          (context->s512).state[6] = 0;
          (context->s512).state[7] = 0;
          *data = 0;
          (context->s512).state[5] = 0;
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x30] = '\0';
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x31] = '\0';
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x32] = '\0';
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x33] = '\0';
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x34] = '\0';
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x35] = '\0';
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x36] = '\0';
          ((cm_sha2_uint8_t *)((long)context + 0x20))[0x37] = '\0';
        }
      }
      uVar1 = (context->s1).bitcount;
      uVar1 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 | (uVar1 & 0xff0000000000) >> 0x18
              | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18
              | (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
      (context->s1).bitcount = uVar1;
      *(ulong *)((context->s1).buffer + 0x38) = uVar1;
      cmSHA1_Internal_Transform(context,(sha_word32 *)data);
      lVar2 = 0;
      do {
        uVar3 = *(uint *)((long)context + lVar2 * 4);
        uVar3 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
        *(uint *)((long)context + lVar2 * 4) = uVar3;
        *(uint *)(digest + lVar2 * 4) = uVar3;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 5);
    }
    memset(context,0,0xd0);
    return;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                ,0x2b8,"void cmSHA1_Final(sha_byte *, SHA_CTX *)");
}

Assistant:

void SHA1_Final(sha_byte digest[], SHA_CTX* context) {
	sha_word32	*d = (sha_word32*)digest;
	unsigned int	usedspace;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	if (digest == (sha_byte*)0) {
		/*
		 * No digest buffer, so we can do nothing
		 * except clean up and go home
		 */
		MEMSET_BZERO(context, sizeof(*context));
		return;
	}

	usedspace = (unsigned int)((context->s1.bitcount >> 3) % 64);
	if (usedspace == 0) {
		/* Set-up for the last transform: */
		MEMSET_BZERO(context->s1.buffer, 56);

		/* Begin padding with a 1 bit: */
		*context->s1.buffer = 0x80;
	} else {
		/* Begin padding with a 1 bit: */
		context->s1.buffer[usedspace++] = 0x80;

		if (usedspace <= 56) {
			/* Set-up for the last transform: */
			MEMSET_BZERO(&context->s1.buffer[usedspace], 56 - usedspace);
		} else {
			if (usedspace < 64) {
				MEMSET_BZERO(&context->s1.buffer[usedspace], 64 - usedspace);
			}
			/* Do second-to-last transform: */
			SHA1_Internal_Transform(context, (const sha_word32*)context->s1.buffer);

			/* And set-up for the last transform: */
			MEMSET_BZERO(context->s1.buffer, 56);
		}
		/* Clean up: */
		usedspace = 0;
	}
	/* Set the bit count: */
#if BYTE_ORDER == LITTLE_ENDIAN
	/* Convert FROM host byte order */
	REVERSE64(context->s1.bitcount,context->s1.bitcount);
#endif
	MEMCPY_BCOPY(&context->s1.buffer[56], &context->s1.bitcount,
		     sizeof(sha_word64));

	/* Final transform: */
	SHA1_Internal_Transform(context, (const sha_word32*)context->s1.buffer);

	/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
	{
		/* Convert TO host byte order */
		int	j;
		for (j = 0; j < (SHA1_DIGEST_LENGTH >> 2); j++) {
			REVERSE32(context->s1.state[j],context->s1.state[j]);
			*d++ = context->s1.state[j];
		}
	}
#else
	MEMCPY_BCOPY(d, context->s1.state, SHA1_DIGEST_LENGTH);
#endif

	/* Clean up: */
	MEMSET_BZERO(context, sizeof(*context));
}